

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Arcflow::count_max_rep
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Arcflow *this,
          vector<int,_std::allocator<int>_> *space,int i0,int sub_i0)

{
  bool bVar1;
  pointer pIVar2;
  pointer pvVar3;
  pointer piVar4;
  pointer piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> *local_40;
  
  local_40 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)(this->inst).nsizes,&local_41);
  if (i0 < (this->inst).nsizes) {
    bVar1 = (this->inst).binary;
    pIVar2 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar3 = (this->weights).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (space->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar13 = (long)i0;
    do {
      uVar11 = 1;
      if (bVar1 == false) {
        uVar11 = pIVar2[lVar13].demand;
      }
      uVar10 = uVar11 - sub_i0;
      if ((int)(uVar11 - sub_i0) < 1) {
        uVar10 = 0;
      }
      if (lVar13 != i0) {
        uVar10 = uVar11;
      }
      uVar12 = (ulong)uVar10;
      piVar4[lVar13] = uVar10;
      piVar6 = pIVar2[lVar13].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = *(pointer *)
                ((long)&pIVar2[lVar13].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl
                + 8);
      if (piVar6 != piVar7) {
        lVar8 = *(long *)&pvVar3[lVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        do {
          piVar14 = piVar6 + 1;
          uVar9 = (long)piVar5[*piVar6] / (long)*(int *)(lVar8 + (long)*piVar6 * 4);
          if ((int)uVar9 < (int)uVar12) {
            uVar12 = uVar9 & 0xffffffff;
          }
          piVar4[lVar13] = (int)uVar12;
        } while (((int)uVar12 != 0) && (piVar6 = piVar14, piVar14 != piVar7));
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->inst).nsizes);
  }
  return local_40;
}

Assistant:

std::vector<int> Arcflow::count_max_rep(const std::vector<int> &space, int i0 = 0,
										int sub_i0 = 0) const {
	std::vector<int> r(inst.nsizes);
	for (int i = i0; i < inst.nsizes; i++) {
		int dem = inst.binary ? 1 : sitems[i].demand;
		r[i] = i != i0 ? dem : std::max(0, dem - sub_i0);
		for (int d : sitems[i].nonzero) {
			r[i] = std::min(r[i], space[d] / weights[i][d]);
			if (!r[i]) {
				break;
			}
		}
	}
	return r;
}